

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowCollectionEnd(Scanner *this,bool IsSequence)

{
  undefined1 local_68 [8];
  Token T;
  bool IsSequence_local;
  Scanner *this_local;
  
  T.Value.field_2._M_local_buf[0xf] = IsSequence;
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = false;
  Token::Token((Token *)local_68);
  local_68._0_4_ = TK_FlowMappingEnd;
  if ((T.Value.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_68._0_4_ = TK_FlowSequenceEnd;
  }
  T._0_8_ = this->Current;
  T.Range.Data = (char *)0x1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_68);
  if (this->FlowLevel != 0) {
    this->FlowLevel = this->FlowLevel - 1;
  }
  Token::~Token((Token *)local_68);
  return true;
}

Assistant:

bool Scanner::scanFlowCollectionEnd(bool IsSequence) {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = false;
  Token T;
  T.Kind = IsSequence ? Token::TK_FlowSequenceEnd
                      : Token::TK_FlowMappingEnd;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  if (FlowLevel)
    --FlowLevel;
  return true;
}